

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplex.cpp
# Opt level: O0

void setSolutionStatus(HighsInfo *highs_info)

{
  HighsInfo *highs_info_local;
  
  if ((highs_info->super_HighsInfoStruct).num_primal_infeasibilities < 0) {
    (highs_info->super_HighsInfoStruct).primal_solution_status = 0;
  }
  else if ((highs_info->super_HighsInfoStruct).num_primal_infeasibilities == 0) {
    (highs_info->super_HighsInfoStruct).primal_solution_status = 2;
  }
  else {
    (highs_info->super_HighsInfoStruct).primal_solution_status = 1;
  }
  if ((highs_info->super_HighsInfoStruct).num_dual_infeasibilities < 0) {
    (highs_info->super_HighsInfoStruct).dual_solution_status = 0;
  }
  else if ((highs_info->super_HighsInfoStruct).num_dual_infeasibilities == 0) {
    (highs_info->super_HighsInfoStruct).dual_solution_status = 2;
  }
  else {
    (highs_info->super_HighsInfoStruct).dual_solution_status = 1;
  }
  return;
}

Assistant:

void setSolutionStatus(HighsInfo& highs_info) {
  if (highs_info.num_primal_infeasibilities < 0) {
    highs_info.primal_solution_status = kSolutionStatusNone;
  } else if (highs_info.num_primal_infeasibilities == 0) {
    highs_info.primal_solution_status = kSolutionStatusFeasible;
  } else {
    highs_info.primal_solution_status = kSolutionStatusInfeasible;
  }
  if (highs_info.num_dual_infeasibilities < 0) {
    highs_info.dual_solution_status = kSolutionStatusNone;
  } else if (highs_info.num_dual_infeasibilities == 0) {
    highs_info.dual_solution_status = kSolutionStatusFeasible;
  } else {
    highs_info.dual_solution_status = kSolutionStatusInfeasible;
  }
}